

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

shared_ptr<kratos::SwitchStmt> __thiscall
kratos::TransformIfCase::change_if_to_switch
          (TransformIfCase *this,shared_ptr<kratos::IfStmt> *stmt,
          vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
          *if_stmts)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  element_type *peVar5;
  const_iterator __first;
  const_iterator __last;
  shared_ptr<kratos::ScopedStmtBlock> *psVar6;
  __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var7;
  StmtBlock *pSVar8;
  element_type *peVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pair<const_char_*,_int> pVar10;
  shared_ptr<kratos::SwitchStmt> sVar11;
  bool local_219;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [40];
  shared_ptr<kratos::Const> local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_140;
  undefined1 local_130 [32];
  undefined1 local_110 [24];
  undefined1 local_f8 [8];
  shared_ptr<kratos::Const> condition;
  __normal_iterator<const_std::shared_ptr<kratos::IfStmt>_*,_std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>_>
  local_d0;
  element_type *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_c0;
  pair<const_char_*,_int> local_b0;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  local_99;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_98;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  local_90;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_88;
  enable_shared_from_this<kratos::Var> local_70;
  undefined1 local_59;
  __node_base local_58;
  Var *target;
  undefined1 local_40 [16];
  undefined1 local_30 [8];
  shared_ptr<kratos::Expr> expr;
  vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
  *if_stmts_local;
  shared_ptr<kratos::IfStmt> *stmt_local;
  shared_ptr<kratos::SwitchStmt> *switch_;
  
  expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)if_stmts;
  std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)stmt);
  IfStmt::predicate((IfStmt *)local_40);
  std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_40)
  ;
  Var::as<kratos::Expr>((Var *)local_30);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_40);
  peVar3 = std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )local_30);
  local_58._M_nxt = (_Hash_node_base *)peVar3->left;
  local_59 = 0;
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_70);
  std::make_shared<kratos::SwitchStmt,std::shared_ptr<kratos::Var>>((shared_ptr<kratos::Var> *)this)
  ;
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_70);
  iVar2 = (*((IRNode *)&(local_58._M_nxt)->_M_nxt)->_vptr_IRNode[0xd])();
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0xbc) & 1) != 0) {
    peVar4 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)stmt);
    local_90._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::begin(&(peVar4->super_Stmt).super_IRNode.fn_name_ln);
    peVar4 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)stmt);
    local_98._M_current =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          *)std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::end(&(peVar4->super_Stmt).super_IRNode.fn_name_ln);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
    ::allocator(&local_99);
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::
    vector<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_int>*,std::vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>>,void>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&local_88,local_90,local_98,&local_99);
    peVar5 = std::__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::operator=(&(peVar5->super_Stmt).super_IRNode.fn_name_ln,&local_88);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~vector(&local_88);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
    ::~allocator(&local_99);
    peVar5 = std::__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_c0._12_4_ = 0x55;
    pVar10 = std::make_pair<char_const(&)[81],int>
                       ((char (*) [81])
                        "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/optimize.cc"
                        ,(int *)(local_c0._M_local_buf + 0xc));
    local_c8 = (element_type *)pVar10.first;
    local_c0._M_allocated_capacity._0_4_ = pVar10.second;
    local_b0.first = (char *)local_c8;
    local_b0.second = local_c0._M_allocated_capacity._0_4_;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)&(peVar5->super_Stmt).super_IRNode.fn_name_ln,&local_b0);
  }
  do {
    __first = std::
              vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
              ::begin((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                       *)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
    __last = std::
             vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
             ::end((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                    *)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi);
    local_d0 = std::
               find<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::IfStmt>const*,std::vector<std::shared_ptr<kratos::IfStmt>,std::allocator<std::shared_ptr<kratos::IfStmt>>>>,std::shared_ptr<kratos::IfStmt>>
                         ((__normal_iterator<const_std::shared_ptr<kratos::IfStmt>_*,_std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>_>
                           )__first._M_current,
                          (__normal_iterator<const_std::shared_ptr<kratos::IfStmt>_*,_std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>_>
                           )__last._M_current,stmt);
    condition.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
         ::end(expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    bVar1 = __gnu_cxx::operator!=
                      (&local_d0,
                       (__normal_iterator<const_std::shared_ptr<kratos::IfStmt>_*,_std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>_>
                        *)&condition.super___shared_ptr<kratos::Const,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar1) break;
    std::__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_30);
    Var::as<kratos::Const>((Var *)local_f8);
    peVar5 = std::__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar4 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)stmt);
    psVar6 = IfStmt::then_body(peVar4);
    std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ScopedStmtBlock,void>
              ((shared_ptr<kratos::Stmt> *)(local_110 + 8),psVar6);
    SwitchStmt::add_switch_case
              (peVar5,(shared_ptr<kratos::Const> *)local_f8,
               (shared_ptr<kratos::Stmt> *)(local_110 + 8));
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_110 + 8));
    peVar4 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)stmt);
    p_Var7 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)IfStmt::else_body(peVar4);
    pSVar8 = &std::
              __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var7)->super_StmtBlock;
    bVar1 = StmtBlock::empty(pSVar8);
    local_140._M_local_buf[0xf] = 0;
    local_219 = false;
    if (!bVar1) {
      local_130._24_8_ =
           std::
           vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
           ::begin((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                    *)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi);
      local_130._16_8_ =
           std::
           vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
           ::end((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                  *)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi);
      peVar4 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stmt);
      p_Var7 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)IfStmt::else_body(peVar4);
      peVar9 = std::
               __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(p_Var7);
      StmtBlock::operator[]((StmtBlock *)local_130,(uint32_t)peVar9);
      local_140._M_local_buf[0xf] = 1;
      local_110._0_8_ =
           std::
           find<__gnu_cxx::__normal_iterator<std::shared_ptr<kratos::IfStmt>const*,std::vector<std::shared_ptr<kratos::IfStmt>,std::allocator<std::shared_ptr<kratos::IfStmt>>>>,std::shared_ptr<kratos::Stmt>>
                     ((__normal_iterator<const_std::shared_ptr<kratos::IfStmt>_*,_std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>_>
                       )local_130._24_8_,
                      (__normal_iterator<const_std::shared_ptr<kratos::IfStmt>_*,_std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>_>
                       )local_130._16_8_,(shared_ptr<kratos::Stmt> *)local_130);
      local_140._M_allocated_capacity =
           (size_type)
           std::
           vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
           ::end((vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>
                  *)expr.super___shared_ptr<kratos::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi);
      local_219 = __gnu_cxx::operator==
                            ((__normal_iterator<const_std::shared_ptr<kratos::IfStmt>_*,_std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>_>
                              *)local_110,
                             (__normal_iterator<const_std::shared_ptr<kratos::IfStmt>_*,_std::vector<std::shared_ptr<kratos::IfStmt>,_std::allocator<std::shared_ptr<kratos::IfStmt>_>_>_>
                              *)&local_140._M_allocated_capacity);
    }
    if ((local_140._M_local_buf[0xf] & 1U) != 0) {
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_130);
    }
    if (local_219 == false) {
      peVar4 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stmt);
      p_Var7 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)IfStmt::else_body(peVar4);
      pSVar8 = &std::
                __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var7)->super_StmtBlock;
      bVar1 = StmtBlock::empty(pSVar8);
      if (bVar1) {
        local_178._20_4_ = 3;
      }
      else {
        peVar4 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)stmt);
        p_Var7 = (__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)IfStmt::else_body(peVar4);
        peVar9 = std::
                 __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*(p_Var7);
        StmtBlock::operator[]((StmtBlock *)local_188,(uint32_t)peVar9);
        std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   local_188);
        Stmt::as<kratos::IfStmt>((Stmt *)local_178);
        std::shared_ptr<kratos::IfStmt>::operator=(stmt,(shared_ptr<kratos::IfStmt> *)local_178);
        std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_178);
        std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_188);
        std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   stmt);
        IfStmt::predicate((IfStmt *)local_1a8);
        std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   local_1a8);
        Var::as<kratos::Expr>((Var *)local_198);
        std::shared_ptr<kratos::Expr>::operator=
                  ((shared_ptr<kratos::Expr> *)local_30,(shared_ptr<kratos::Expr> *)local_198);
        std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_198);
        std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_1a8);
        local_178._20_4_ = 0;
      }
    }
    else {
      peVar5 = std::
               __shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      std::shared_ptr<kratos::Const>::shared_ptr(&local_150,(nullptr_t)0x0);
      peVar4 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stmt);
      psVar6 = IfStmt::else_body(peVar4);
      std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::ScopedStmtBlock,void>
                ((shared_ptr<kratos::Stmt> *)(local_178 + 0x18),psVar6);
      SwitchStmt::add_switch_case(peVar5,&local_150,(shared_ptr<kratos::Stmt> *)(local_178 + 0x18));
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_178 + 0x18));
      std::shared_ptr<kratos::Const>::~shared_ptr(&local_150);
      local_178._20_4_ = 3;
    }
    std::shared_ptr<kratos::Const>::~shared_ptr((shared_ptr<kratos::Const> *)local_f8);
  } while (local_178._20_4_ == 0);
  local_59 = 1;
  local_178._20_4_ = 1;
  std::shared_ptr<kratos::Expr>::~shared_ptr((shared_ptr<kratos::Expr> *)local_30);
  sVar11.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar11.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::SwitchStmt>)
         sVar11.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SwitchStmt> static change_if_to_switch(
        std::shared_ptr<IfStmt> stmt, const std::vector<std::shared_ptr<IfStmt>>& if_stmts) {
        auto expr = stmt->predicate()->as<Expr>();
        // we assume that this is a valid case (see has_target_if)
        auto* target = expr->left;
        std::shared_ptr<SwitchStmt> switch_ =
            std::make_shared<SwitchStmt>(target->shared_from_this());
        if (target->generator()->debug) {
            switch_->fn_name_ln = std::vector<std::pair<std::string, uint32_t>>(
                stmt->fn_name_ln.begin(), stmt->fn_name_ln.end());
            switch_->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
        }

        while (std::find(if_stmts.begin(), if_stmts.end(), stmt) != if_stmts.end()) {
            auto condition = expr->right->as<Const>();
            switch_->add_switch_case(condition, stmt->then_body());
            if (!stmt->else_body()->empty() &&
                std::find(if_stmts.begin(), if_stmts.end(), (*stmt->else_body())[0]) ==
                    if_stmts.end()) {
                // we have reached the end
                // add default statement
                switch_->add_switch_case(nullptr, stmt->else_body());
                break;
            } else if (!stmt->else_body()->empty()) {
                // switch to the else case
                stmt = (*stmt->else_body())[0]->as<IfStmt>();
                expr = stmt->predicate()->as<Expr>();
            } else {
                break;
            }
        }

        return switch_;
    }